

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::MacroExpansion::append
          (MacroExpansion *this,Token token,SourceLocation location,bool allowLineContinuation)

{
  BumpAllocator *pBVar1;
  SmallVectorBase<slang::parsing::Token> *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  uint uVar4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  string_view sVar6;
  string_view rawText;
  SmallVector<slang::parsing::Trivia,_8UL> newTrivia;
  Token local_f0;
  Token local_e0;
  undefined8 local_d0;
  char *pcStack_c8;
  SmallVectorBase<slang::parsing::Trivia> local_c0 [3];
  
  uVar4 = token._0_4_;
  local_f0 = token;
  if (this->any == false) {
    pBVar1 = this->alloc;
    if (this->isTopLevel == false) {
      sVar5 = Token::trivia(&this->usageSite);
    }
    else {
      sVar5 = (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0);
    }
    local_f0 = Token::withTrivia(&local_f0,pBVar1,sVar5);
    uVar4 = local_f0._0_4_;
    this->any = true;
  }
  if ((uVar4 & 0xffff) == 0x15f && !allowLineContinuation) {
    local_c0[0].len = 0;
    local_c0[0].data_ = (pointer)local_c0[0].firstElement;
    local_c0[0].cap = 8;
    sVar5 = Token::trivia(&local_f0);
    SmallVectorBase<slang::parsing::Trivia>::append<slang::parsing::Trivia_const*,void>
              (local_c0,sVar5.data_,sVar5.data_ + sVar5.size_);
    sVar6 = Token::rawText(&local_f0);
    if (sVar6._M_len == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0)
      ;
    }
    rawText._M_str = sVar6._M_str + 1;
    rawText._M_len = sVar6._M_len - 1;
    Trivia::Trivia((Trivia *)&local_e0,EndOfLine,rawText);
    SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
              (local_c0,(Trivia *)&local_e0);
    pSVar2 = this->dest;
    pBVar1 = this->alloc;
    iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy(local_c0,(EVP_PKEY_CTX *)pBVar1,src);
    sVar5.data_._4_4_ = extraout_var;
    sVar5.data_._0_4_ = iVar3;
    local_d0 = 0;
    pcStack_c8 = "";
    sVar5.size_ = extraout_RDX;
    Token::Token(&local_e0,pBVar1,EmptyMacroArgument,sVar5,(string_view)(ZEXT816(0x3f0621) << 0x40),
                 location);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>(pSVar2,&local_e0);
    if ((Token *)local_c0[0].data_ != (Token *)local_c0[0].firstElement) {
      free(local_c0[0].data_);
    }
  }
  else {
    pSVar2 = this->dest;
    local_c0[0]._0_16_ = (undefined1  [16])Token::withLocation(&local_f0,this->alloc,location);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
              (pSVar2,(Token *)local_c0);
  }
  return;
}

Assistant:

void Preprocessor::MacroExpansion::append(Token token, SourceLocation location,
                                          bool allowLineContinuation) {
    if (!any) {
        if (!isTopLevel)
            token = token.withTrivia(alloc, usageSite.trivia());
        else
            token = token.withTrivia(alloc, {});
        any = true;
    }

    // Line continuations get stripped out when we expand macros and become newline trivia instead.
    if (token.kind == TokenKind::LineContinuation && !allowLineContinuation) {
        SmallVector<Trivia, 8> newTrivia;
        newTrivia.append(token.trivia());
        newTrivia.push_back(Trivia(TriviaKind::EndOfLine, token.rawText().substr(1)));

        dest.push_back(
            Token(alloc, TokenKind::EmptyMacroArgument, newTrivia.copy(alloc), "", location));
    }
    else {
        dest.push_back(token.withLocation(alloc, location));
    }
}